

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

void loadXYZ(string *filePath,vector<Vector3D,_std::allocator<Vector3D>_> *pos)

{
  char cVar1;
  istream *piVar2;
  string line;
  double y;
  double x;
  double z;
  ifstream file;
  stringstream lineStream;
  undefined1 *local_3f8;
  ulong local_3f0;
  undefined1 local_3e8;
  undefined7 uStack_3e7;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  long local_3c0 [4];
  byte abStack_3a0 [488];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::ifstream::ifstream((istream *)local_3c0,(string *)filePath,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    if ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) == 0) {
      do {
        local_3f0 = 0;
        local_3e8 = 0;
        local_3f8 = &local_3e8;
        cVar1 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) +
                                (char)(istream *)local_3c0);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_3f8,cVar1);
        if (3 < local_3f0) {
          std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_3f8,_S_out|_S_in);
          piVar2 = std::istream::_M_extract<double>((double *)local_1b8);
          piVar2 = std::istream::_M_extract<double>((double *)piVar2);
          std::istream::_M_extract<double>((double *)piVar2);
          std::vector<Vector3D,std::allocator<Vector3D>>::emplace_back<double&,double&,double&>
                    ((vector<Vector3D,std::allocator<Vector3D>> *)pos,&local_3d0,&local_3d8,
                     &local_3c8);
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        if (local_3f8 != &local_3e8) {
          operator_delete(local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
        }
      } while ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) == 0);
    }
    std::ifstream::close();
  }
  std::ifstream::~ifstream(local_3c0);
  return;
}

Assistant:

void loadXYZ(std::string filePath, std::vector<Vector3D> &pos){
    std::ifstream file(filePath);
    if (file.is_open()){
        while (file){
            std::string line;
            std::getline(file, line);
            if(line.size()>3){
                std::stringstream lineStream(line);
                double x, y, z;
                lineStream >> x >> y >>z;
                pos.emplace_back(x, y, z);
            }
        }
        file.close();
    }




}